

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_function.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  void *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined1 local_90 [8];
  enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
  result;
  allocator local_31;
  string local_30 [8];
  string input;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"./sample/lipsum.txt",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  bm::GenericBench<std::chrono::_V2::steady_clock>::
  mark<unsigned_long(&)(std::__cxx11::string_const&),std::__cxx11::string&>
            ((enable_if_type<_std::is_void<result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>::value,_std::pair<Mark,_result_type<unsigned_long_(&(basic_string<char>_&))(const_basic_string<char>_&)>_>_>
              *)local_90,(GenericBench<std::chrono::_V2::steady_clock> *)count_words,
             (_func_unsigned_long_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
              *)local_30,in_RCX);
  poVar1 = bm::operator<<((ostream *)&std::cout,(Mark *)local_90);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"Retval = ");
  this = (void *)std::ostream::operator<<(poVar1,(ulong)result.first._overflow_callback._M_invoker);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::pair<bm::Mark,_unsigned_long>::~pair((pair<bm::Mark,_unsigned_long> *)local_90);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main()
{
    std::string input("./sample/lipsum.txt");
    auto result = Bench::mark(count_words, input);
    std::cout << result.first << std::endl;
    std::cout << "Retval = " << result.second << std::endl;
    return 0;
}